

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  int *piVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *pIVar9;
  ImGuiContext *pIVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  ImDrawCmd *pIVar15;
  int iVar16;
  undefined1 auVar17 [16];
  
  pIVar10 = GImGui;
  lVar11 = (long)(this->_TextureIdStack).Size;
  if (lVar11 == 0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = (this->_TextureIdStack).Data[lVar11 + -1];
  }
  uVar6 = (this->CmdBuffer).Size;
  uVar14 = (ulong)uVar6;
  if (uVar14 != 0) {
    if ((int)uVar6 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x35d,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar9 = (this->CmdBuffer).Data;
    if ((pIVar9 + (uVar14 - 1) != (ImDrawCmd *)0x0) &&
       (((pIVar9[uVar14 - 1].ElemCount == 0 || (pIVar9[uVar14 - 1].TextureId == pvVar12)) &&
        (pIVar9[uVar14 - 1].UserCallback == (ImDrawCallback)0x0)))) {
      if ((uVar6 != 1) && (pIVar9[uVar14 - 2].TextureId == pvVar12)) {
        lVar11 = (long)(this->_ClipRectStack).Size;
        pIVar8 = &GNullClipRect;
        if (lVar11 != 0) {
          pIVar8 = (this->_ClipRectStack).Data + lVar11 + -1;
        }
        auVar17[0] = -(*(char *)&pIVar8->x == *(char *)&pIVar9[uVar14 - 2].ClipRect.x);
        auVar17[1] = -(*(char *)((long)&pIVar8->x + 1) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.x + 1));
        auVar17[2] = -(*(char *)((long)&pIVar8->x + 2) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.x + 2));
        auVar17[3] = -(*(char *)((long)&pIVar8->x + 3) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.x + 3));
        auVar17[4] = -(*(char *)&pIVar8->y == *(char *)&pIVar9[uVar14 - 2].ClipRect.y);
        auVar17[5] = -(*(char *)((long)&pIVar8->y + 1) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.y + 1));
        auVar17[6] = -(*(char *)((long)&pIVar8->y + 2) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.y + 2));
        auVar17[7] = -(*(char *)((long)&pIVar8->y + 3) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.y + 3));
        auVar17[8] = -(*(char *)&pIVar8->z == *(char *)&pIVar9[uVar14 - 2].ClipRect.z);
        auVar17[9] = -(*(char *)((long)&pIVar8->z + 1) ==
                      *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.z + 1));
        auVar17[10] = -(*(char *)((long)&pIVar8->z + 2) ==
                       *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.z + 2));
        auVar17[0xb] = -(*(char *)((long)&pIVar8->z + 3) ==
                        *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.z + 3));
        auVar17[0xc] = -(*(char *)&pIVar8->w == *(char *)&pIVar9[uVar14 - 2].ClipRect.w);
        auVar17[0xd] = -(*(char *)((long)&pIVar8->w + 1) ==
                        *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.w + 1));
        auVar17[0xe] = -(*(char *)((long)&pIVar8->w + 2) ==
                        *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.w + 2));
        auVar17[0xf] = -(*(char *)((long)&pIVar8->w + 3) ==
                        *(char *)((long)&pIVar9[uVar14 - 2].ClipRect.w + 3));
        if (((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar17[0xf] >> 7) << 0xf) == 0xffff) &&
           (pIVar9[uVar14 - 2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = uVar6 - 1;
          return;
        }
      }
      pIVar9[uVar14 - 1].TextureId = pvVar12;
      return;
    }
  }
  lVar11 = (long)(this->_ClipRectStack).Size;
  pIVar8 = &GNullClipRect;
  if (lVar11 != 0) {
    pIVar8 = (this->_ClipRectStack).Data + lVar11 + -1;
  }
  fVar5 = pIVar8->x;
  uVar3 = pIVar8->y;
  uVar4 = pIVar8->z;
  lVar11 = (long)(this->_TextureIdStack).Size;
  if (lVar11 == 0) {
    pvVar12 = (void *)0x0;
  }
  else {
    pvVar12 = (this->_TextureIdStack).Data[lVar11 + -1];
  }
  if (((float)uVar4 < fVar5) || (fVar2 = pIVar8->w, fVar2 < (float)uVar3)) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0xa8,"void ImDrawList::AddDrawCmd()");
  }
  iVar7 = (this->CmdBuffer).Size;
  if (iVar7 != (this->CmdBuffer).Capacity) {
    pIVar9 = (this->CmdBuffer).Data;
    goto LAB_0014c2d0;
  }
  if (iVar7 == 0) {
    iVar13 = 8;
  }
  else {
    iVar13 = iVar7 / 2 + iVar7;
  }
  iVar16 = iVar7 + 1;
  if (iVar7 + 1 < iVar13) {
    iVar16 = iVar13;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar9 = (ImDrawCmd *)(*(pIVar10->IO).MemAllocFn)((long)iVar16 * 0x30);
  pIVar15 = (this->CmdBuffer).Data;
  if (pIVar15 == (ImDrawCmd *)0x0) {
LAB_0014c2b3:
    pIVar15 = (ImDrawCmd *)0x0;
    pIVar10 = GImGui;
  }
  else {
    memcpy(pIVar9,pIVar15,(long)(this->CmdBuffer).Size * 0x30);
    pIVar10 = GImGui;
    pIVar15 = (this->CmdBuffer).Data;
    if (pIVar15 == (ImDrawCmd *)0x0) goto LAB_0014c2b3;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar10->IO).MemFreeFn)(pIVar15);
  (this->CmdBuffer).Data = pIVar9;
  (this->CmdBuffer).Capacity = iVar16;
  iVar7 = (this->CmdBuffer).Size;
LAB_0014c2d0:
  (this->CmdBuffer).Size = iVar7 + 1;
  pIVar9[iVar7].ElemCount = 0;
  pIVar9[iVar7].ClipRect.x = fVar5;
  pIVar9[iVar7].ClipRect.y = (float)uVar3;
  pIVar9[iVar7].ClipRect.z = (float)uVar4;
  pIVar9[iVar7].ClipRect.w = fVar2;
  pIVar9[iVar7].TextureId = pvVar12;
  pIVar9[iVar7].UserCallback = (ImDrawCallback)0x0;
  (&pIVar9[iVar7].UserCallback)[1] = (ImDrawCallback)0x0;
  return;
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}